

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

bool common_chat_verify_template(string *tmpl,bool use_jinja)

{
  int iVar1;
  undefined8 uVar2;
  byte in_SIL;
  int res;
  llama_chat_message chat [1];
  exception *e;
  common_chat_templates_inputs inputs;
  common_chat_templates_ptr tmpls;
  common_chat_msg msg;
  common_chat_msg *in_stack_fffffffffffffc30;
  common_chat_templates *in_stack_fffffffffffffc38;
  common_chat_msg *in_stack_fffffffffffffc40;
  initializer_list<common_chat_msg> in_stack_fffffffffffffc48;
  allocator<char> *in_stack_fffffffffffffc60;
  undefined8 ***pppuVar3;
  common_chat_msg *in_stack_fffffffffffffc68;
  undefined8 ***pppuVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  common_chat_msg *this;
  char *local_368;
  char *local_360;
  undefined8 **local_2b8;
  undefined1 **local_2b0 [14];
  string *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  llama_model *in_stack_fffffffffffffdd8;
  undefined8 **local_1e0;
  undefined8 local_1d8;
  undefined1 local_149 [40];
  allocator<char> local_121;
  string local_120 [56];
  string local_e8 [32];
  string local_c8 [183];
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  if (local_11 == 0) {
    local_368 = "user";
    local_360 = "test";
    uVar2 = std::__cxx11::string::c_str();
    iVar1 = llama_chat_apply_template(uVar2,&local_368,1,1,0,0);
    local_1 = -1 < iVar1;
  }
  else {
    common_chat_msg::common_chat_msg(in_stack_fffffffffffffc40);
    std::__cxx11::string::operator=(local_e8,"user");
    std::__cxx11::string::operator=(local_c8,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60
              );
    this = (common_chat_msg *)local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&this->role,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    common_chat_templates_init
              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    common_chat_templates_inputs::common_chat_templates_inputs
              ((common_chat_templates_inputs *)in_stack_fffffffffffffc30);
    local_2b8 = local_2b0;
    common_chat_msg::common_chat_msg(this,in_stack_fffffffffffffc68);
    local_1e0 = local_2b0;
    local_1d8 = 1;
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::operator=
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)
               in_stack_fffffffffffffc40,in_stack_fffffffffffffc48);
    pppuVar3 = (undefined8 ***)local_2b0;
    pppuVar4 = &local_1e0;
    do {
      pppuVar4 = pppuVar4 + -0x1a;
      common_chat_msg::~common_chat_msg(in_stack_fffffffffffffc30);
    } while (pppuVar4 != pppuVar3);
    std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::get
              ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)
               in_stack_fffffffffffffc30);
    common_chat_templates_apply
              (in_stack_fffffffffffffc38,(common_chat_templates_inputs *)in_stack_fffffffffffffc30);
    common_chat_params::~common_chat_params((common_chat_params *)in_stack_fffffffffffffc30);
    local_1 = 1;
    common_chat_templates_inputs::~common_chat_templates_inputs
              ((common_chat_templates_inputs *)in_stack_fffffffffffffc30);
    std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::~unique_ptr
              ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)
               in_stack_fffffffffffffc40);
    common_chat_msg::~common_chat_msg(in_stack_fffffffffffffc30);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool common_chat_verify_template(const std::string & tmpl, bool use_jinja) {
    if (use_jinja) {
        try {
            common_chat_msg msg;
            msg.role = "user";
            msg.content = "test";

            auto tmpls = common_chat_templates_init(/* model= */ nullptr, tmpl);

            common_chat_templates_inputs inputs;
            inputs.messages = {msg};

            common_chat_templates_apply(tmpls.get(), inputs);
            return true;
        } catch (const std::exception & e) {
            LOG_ERR("%s: failed to apply template: %s\n", __func__, e.what());
            return false;
        }
    }
    llama_chat_message chat[] = {{"user", "test"}};
    const int res = llama_chat_apply_template(tmpl.c_str(), chat, 1, true, nullptr, 0);
    return res >= 0;
}